

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void charevnt_breakfast_vischar(tgestate_t *state,route_t *route)

{
  character_t character_00;
  route_t *in_RSI;
  tgestate_t *in_RDI;
  vischar_t *vischar;
  character_t character;
  route_t *in_stack_ffffffffffffffd8;
  
  character_00 = (character_t)((tgestate_t *)in_RDI->IY)->width;
  if (character_00 == '\0') {
    set_hero_route((tgestate_t *)in_RDI->IY,in_stack_ffffffffffffffd8);
  }
  else {
    charevnt_breakfast_common(in_RDI,character_00,in_RSI);
  }
  return;
}

Assistant:

void charevnt_breakfast_vischar(tgestate_t *state, route_t *route)
{
  character_t character;
  vischar_t  *vischar;

  assert(state != NULL);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  vischar = state->IY;
  ASSERT_VISCHAR_VALID(vischar);

  character = vischar->character;
  if (character == character_0_COMMANDANT)
  {
    static const route_t t = { routeindex_43_7833, 0 }; /* was BC */
    set_hero_route(state, &t);
  }
  else
  {
    charevnt_breakfast_common(state, character, route); /* was fallthrough */
  }
}